

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *weights)

{
  char cVar1;
  uint32_t uVar2;
  uint uVar3;
  value_type vVar4;
  pointer head;
  bool bVar5;
  size_type sVar6;
  invalid_argument *piVar7;
  reference pvVar8;
  uint32_t *puVar9;
  reference pvVar10;
  reference pvVar11;
  Node *head_00;
  Node *pNVar12;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *this_00;
  pointer *this_01;
  reference ppNVar13;
  const_reference pvVar14;
  pointer local_168;
  Node **kt_1;
  iterator __end5;
  iterator __begin5;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range5;
  Node **kt;
  iterator __end4;
  iterator __begin4;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range4;
  pointer jt;
  Node *curr;
  reference ppStack_b8;
  uint32_t code;
  pair<int,_int> *it_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Alignment *__range1_1;
  Node *last;
  Node *prev;
  Node *begin;
  pair<int,_int> *it;
  const_iterator __end1;
  const_iterator __begin1;
  Alignment *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid;
  uint local_40;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *weights_local;
  uint32_t sequence_len_local;
  char *sequence_local;
  Alignment *alignment_local;
  Graph *this_local;
  
  if (sequence_len != 0) {
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(weights);
    if (sequence_len != sVar6) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar7,
                 "[spoa::Graph::AddAlignment] error: sequence and weights are of unequal size!");
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    for (local_40 = 0; local_40 < sequence_len; local_40 = local_40 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->coder_,(long)sequence[local_40]);
      if (*pvVar8 == -1) {
        uVar2 = this->num_codes_;
        puVar9 = (uint32_t *)
                 std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->coder_,(long)sequence[local_40]);
        *puVar9 = uVar2;
        cVar1 = sequence[local_40];
        uVar3 = this->num_codes_;
        this->num_codes_ = uVar3 + 1;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->decoder_,(ulong)uVar3);
        *pvVar8 = (int)cVar1;
      }
    }
    bVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                      (alignment);
    if (bVar5) {
      valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &AddSequence(this,sequence,weights,0,sequence_len)->id;
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 (Node **)&valid.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      TopologicalSort(this);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (alignment);
      it = (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(alignment);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                         *)&it), bVar5) {
        begin = (Node *)__gnu_cxx::
                        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        ::operator*(&__end1);
        if (begin->code != 0xffffffff) {
          if (((int)begin->code < 0) || ((int)sequence_len <= (int)begin->code)) {
            piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar7,"[spoa::Graph::AddAlignment] error: invalid alignment");
            __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&__range1,
                     (int *)&begin->code);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end1);
      }
      bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      if (bVar5) {
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar7,"[spoa::Graph::AddAlignment] error: missing sequence in alignment");
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      prev = AddSequence(this,sequence,weights,0,*pvVar10);
      if (prev == (Node *)0x0) {
        local_168 = (pointer)0x0;
      }
      else {
        pvVar11 = std::
                  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                  ::back(&this->nodes_);
        local_168 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get
                              (pvVar11);
      }
      last = local_168;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      head_00 = AddSequence(this,sequence,weights,*pvVar10 + 1,sequence_len);
      __end1_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                           (alignment);
      it_1 = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(alignment)
      ;
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                 *)&it_1), bVar5) {
        ppStack_b8 = __gnu_cxx::
                     __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     ::operator*(&__end1_1);
        if (ppStack_b8->second != -1) {
          puVar9 = (uint32_t *)
                   std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->coder_,(long)sequence[ppStack_b8->second]);
          curr._4_4_ = *puVar9;
          jt = (pointer)0x0;
          if (ppStack_b8->first == -1) {
            pNVar12 = AddNode(this,curr._4_4_);
          }
          else {
            pvVar11 = std::
                      vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                      ::operator[](&this->nodes_,(long)ppStack_b8->first);
            __range4 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                       std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
                       get(pvVar11);
            pNVar12 = (pointer)__range4;
            if (((pointer)__range4)->code != curr._4_4_) {
              this_00 = &((pointer)__range4)->aligned_nodes;
              __end4 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                                 (this_00);
              kt = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                            end(this_00);
              while (bVar5 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                                 *)&kt), bVar5) {
                ppNVar13 = __gnu_cxx::
                           __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                           ::operator*(&__end4);
                if ((*ppNVar13)->code == curr._4_4_) {
                  jt = *ppNVar13;
                  break;
                }
                __gnu_cxx::
                __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::operator++(&__end4);
              }
              pNVar12 = jt;
              if (jt == (pointer)0x0) {
                jt = AddNode(this,curr._4_4_);
                this_01 = &__range4[2].
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                __end5 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                         begin((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                               this_01);
                kt_1 = (Node **)std::
                                vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                                end((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                     *)this_01);
                while (bVar5 = __gnu_cxx::operator!=
                                         (&__end5,(
                                                  __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                                  *)&kt_1), bVar5) {
                  ppNVar13 = __gnu_cxx::
                             __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                             ::operator*(&__end5);
                  std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  emplace_back<spoa::Graph::Node*&>
                            ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &(*ppNVar13)->aligned_nodes,&jt);
                  std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  emplace_back<spoa::Graph::Node*const&>
                            ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &jt->aligned_nodes,ppNVar13);
                  __gnu_cxx::
                  __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                  ::operator++(&__end5);
                }
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &__range4[2].
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&jt);
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &jt->aligned_nodes,(Node **)&__range4);
                pNVar12 = jt;
              }
            }
          }
          jt = pNVar12;
          head = jt;
          if (prev == (Node *)0x0) {
            prev = jt;
          }
          if (last != (Node *)0x0) {
            pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (weights,(long)(ppStack_b8->second + -1));
            vVar4 = *pvVar14;
            pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (weights,(long)ppStack_b8->second);
            AddEdge(this,last,head,vVar4 + *pvVar14);
          }
          last = jt;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end1_1);
      }
      if (head_00 != (Node *)0x0) {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (weights,(ulong)*pvVar10);
        vVar4 = *pvVar14;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (weights,(ulong)(*pvVar10 + 1));
        AddEdge(this,last,head_00,vVar4 + *pvVar14);
      }
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*&>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 &prev);
      TopologicalSort(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
    }
  }
  return;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const std::vector<std::uint32_t>& weights) {
  if (sequence_len == 0) {
    return;
  }
  if (sequence_len != weights.size()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: "
        "sequence and weights are of unequal size!");
  }

  for (std::uint32_t i = 0; i < sequence_len; ++i) {
    if (coder_[sequence[i]] == -1) {
      coder_[sequence[i]] = num_codes_;
      decoder_[num_codes_++] = sequence[i];
    }
  }

  if (alignment.empty()) {
    sequences_.emplace_back(AddSequence(sequence, weights, 0, sequence_len));
    TopologicalSort();
    return;
  }

  std::vector<std::uint32_t> valid;
  for (const auto& it : alignment) {
    if (it.second != -1) {
      if (it.second < 0 || it.second >= static_cast<std::int32_t>(sequence_len)) {  // NOLINT
        throw std::invalid_argument(
            "[spoa::Graph::AddAlignment] error: invalid alignment");
      }
      valid.emplace_back(it.second);
    }
  }
  if (valid.empty()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: missing sequence in alignment");
  }

  // add unaligned bases
  Node* begin = AddSequence(sequence, weights, 0, valid.front());
  Node* prev = begin ? nodes_.back().get() : nullptr;
  Node* last = AddSequence(sequence, weights, valid.back() + 1, sequence_len);

  // add aligned bases
  for (const auto& it : alignment) {
    if (it.second == -1) {
      continue;
    }

    std::uint32_t code = coder_[sequence[it.second]];
    Node* curr = nullptr;
    if (it.first == -1) {
      curr = AddNode(code);
    } else {
      auto jt = nodes_[it.first].get();
      if (jt->code == code) {
        curr = jt;
      } else {
        for (const auto& kt : jt->aligned_nodes) {
          if (kt->code == code) {
            curr = kt;
            break;
          }
        }
        if (!curr) {
          curr = AddNode(code);
          for (const auto& kt : jt->aligned_nodes) {
            kt->aligned_nodes.emplace_back(curr);
            curr->aligned_nodes.emplace_back(kt);
          }
          jt->aligned_nodes.emplace_back(curr);
          curr->aligned_nodes.emplace_back(jt);
        }
      }
    }
    if (!begin) {
      begin = curr;
    }
    if (prev) {  // both nodes contribute to weight
      AddEdge(prev, curr, weights[it.second - 1] + weights[it.second]);
    }
    prev = curr;
  }
  if (last) {
    AddEdge(prev, last, weights[valid.back()] + weights[valid.back() + 1]);
  }
  sequences_.emplace_back(begin);

  TopologicalSort();
}